

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

bool __thiscall
args::ArgumentParser::AddCompletionReply(ArgumentParser *this,string *cur,string *choice)

{
  CompletionFlag *pCVar1;
  bool bVar2;
  OptionType OVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((cur->_M_string_length != 0) &&
     (lVar4 = std::__cxx11::string::find((string *)choice,(ulong)cur), lVar4 != 0)) {
    return false;
  }
  bVar2 = std::operator==(&this->completion->syntax,"bash");
  if ((bVar2) && (OVar3 = ParseOption(this,choice,false), OVar3 == LongFlag)) {
    lVar4 = std::__cxx11::string::find((string *)choice,(ulong)&this->longseparator);
    if (lVar4 != -1) {
      pCVar1 = this->completion;
      std::__cxx11::string::find((string *)choice,(ulong)&this->longseparator);
      std::__cxx11::string::substr((ulong)&local_40,(ulong)choice);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pCVar1->reply
                 ,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      return true;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->completion->reply,choice);
  return true;
}

Assistant:

bool AddCompletionReply(const std::string &cur, const std::string &choice)
            {
                if (cur.empty() || choice.find(cur) == 0)
                {
                    if (completion->syntax == "bash" && ParseOption(choice) == OptionType::LongFlag && choice.find(longseparator) != std::string::npos)
                    {
                        completion->reply.push_back(choice.substr(choice.find(longseparator) + 1));
                    } else
                    {
                        completion->reply.push_back(choice);
                    }
                    return true;
                }

                return false;
            }